

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwDestroyWindow(GLFWwindow *handle)

{
  _GLFWwindow *p_Var1;
  _GLFWwindow *p_Var2;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (handle != (GLFWwindow *)0x0) {
    *(undefined8 *)(handle + 0x268) = 0;
    *(undefined8 *)(handle + 0x270) = 0;
    *(undefined8 *)(handle + 600) = 0;
    *(undefined8 *)(handle + 0x260) = 0;
    *(undefined8 *)(handle + 0x248) = 0;
    *(undefined8 *)(handle + 0x250) = 0;
    *(undefined8 *)(handle + 0x238) = 0;
    *(undefined8 *)(handle + 0x240) = 0;
    *(undefined8 *)(handle + 0x228) = 0;
    *(undefined8 *)(handle + 0x230) = 0;
    *(undefined8 *)(handle + 0x218) = 0;
    *(undefined8 *)(handle + 0x220) = 0;
    *(undefined8 *)(handle + 0x208) = 0;
    *(undefined8 *)(handle + 0x210) = 0;
    *(undefined8 *)(handle + 0x278) = 0;
    p_Var1 = _glfwPlatformGetCurrentContext();
    if (p_Var1 == (_GLFWwindow *)handle) {
      _glfwPlatformMakeContextCurrent((_GLFWwindow *)0x0);
    }
    if (_glfw.cursorWindow == (_GLFWwindow *)handle) {
      _glfw.cursorWindow = (_GLFWwindow *)0x0;
    }
    _glfwPlatformDestroyWindow((_GLFWwindow *)handle);
    p_Var1 = (_GLFWwindow *)&_glfw.windowListHead;
    do {
      p_Var2 = p_Var1;
      p_Var1 = p_Var2->next;
    } while (p_Var1 != (_GLFWwindow *)handle);
    p_Var2->next = *(_GLFWwindow **)handle;
    free(handle);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    // Allow closing of NULL (to match the behavior of free)
    if (window == NULL)
        return;

    // Clear all callbacks to avoid exposing a half torn-down window object
    memset(&window->callbacks, 0, sizeof(window->callbacks));

    // The window's context must not be current on another thread when the
    // window is destroyed
    if (window == _glfwPlatformGetCurrentContext())
        _glfwPlatformMakeContextCurrent(NULL);

    // Clear the focused window pointer if this is the focused window
    if (_glfw.cursorWindow == window)
        _glfw.cursorWindow = NULL;

    _glfwPlatformDestroyWindow(window);

    // Unlink window from global linked list
    {
        _GLFWwindow** prev = &_glfw.windowListHead;

        while (*prev != window)
            prev = &((*prev)->next);

        *prev = window->next;
    }

    free(window);
}